

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_block_tests.cpp
# Opt level: O2

void __thiscall validation_block_tests::mempool_locks_reorg::test_method(mempool_locks_reorg *this)

{
  long lVar1;
  element_type *peVar2;
  __shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  pointer psVar4;
  bool bVar5;
  int iVar6;
  CChainParams *pCVar7;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *val;
  Chainstate *pCVar8;
  int iVar9;
  long lVar10;
  pointer tx;
  __shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2> *p_Var11;
  iterator in_R8;
  iterator pvVar12;
  iterator in_R9;
  iterator pvVar13;
  uint256 *puVar14;
  CMutableTransaction *pCVar15;
  pointer this_00;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  check_type cVar16;
  char *local_408;
  char *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  __shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2> local_3d8;
  char *local_3c8;
  char *local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  thread rpc_thread;
  undefined1 *local_378;
  undefined1 *local_370;
  char *local_368;
  char *local_360;
  vector<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_> reorg;
  char *local_338;
  char *local_330;
  __shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2> local_328;
  undefined1 *local_318;
  undefined1 *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  __shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2> local_2e8;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  txs;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  __shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2> local_258;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  shared_ptr<const_CBlock> last_mined;
  char *local_218;
  unique_ptr<ECC_Context,_std::default_delete<ECC_Context>_> local_210;
  shared_ptr<const_CBlock> local_208;
  unique_ptr<CConnman,_std::default_delete<CConnman>_> local_1f0;
  unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> local_1e8;
  char *local_1e0;
  unique_ptr<CBlockPolicyEstimator,_std::default_delete<CBlockPolicyEstimator>_> local_1d8;
  anon_class_16_2_369edf7f ProcessBlock;
  bool ignored;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock17;
  undefined1 local_1a8 [8];
  element_type *local_1a0;
  __uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_> a_Stack_198 [2];
  CMutableTransaction mtx;
  undefined1 local_a8 [8];
  undefined1 auStack_a0 [8];
  shared_count local_98 [2];
  uint256 tip_init;
  uint256 split_hash;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ProcessBlock.ignored = &ignored;
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
  ;
  local_1d8._M_t.
  super___uniq_ptr_impl<CBlockPolicyEstimator,_std::default_delete<CBlockPolicyEstimator>_>._M_t.
  super__Tuple_impl<0UL,_CBlockPolicyEstimator_*,_std::default_delete<CBlockPolicyEstimator>_>.
  super__Head_base<0UL,_CBlockPolicyEstimator_*,_false>._M_head_impl =
       (__uniq_ptr_data<CBlockPolicyEstimator,_std::default_delete<CBlockPolicyEstimator>,_true,_true>
        )((long)
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
         + 0x68);
  local_1f0._M_t.super___uniq_ptr_impl<CConnman,_std::default_delete<CConnman>_>._M_t.
  super__Tuple_impl<0UL,_CConnman_*,_std::default_delete<CConnman>_>.
  super__Head_base<0UL,_CConnman_*,_false>._M_head_impl =
       (__uniq_ptr_data<CConnman,_std::default_delete<CConnman>,_true,_true>)
       &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8._M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
  super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
  super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl =
       (__uniq_ptr_data<CTxMemPool,_std::default_delete<CTxMemPool>,_true,_true>)
       &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xea;
  file.m_begin = (iterator)&local_1e0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  ProcessBlock.this = this;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1f0,msg);
  Params();
  std::make_shared<CBlock,CBlock_const&>((CBlock *)&split_hash);
  local_208.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)split_hash.super_base_blob<256U>.m_data._M_elems._0_8_;
  local_208.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       split_hash.super_base_blob<256U>.m_data._M_elems._8_8_;
  split_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  split_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  split_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  split_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  split_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  split_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  split_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  split_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  split_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  split_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  split_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  split_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  split_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  split_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  split_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  split_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  bVar5 = test_method::anon_class_16_2_369edf7f::operator()(&ProcessBlock,&local_208);
  tip_init.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  tip_init.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  tip_init.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  tip_init.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  tip_init.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  tip_init.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  tip_init.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  tip_init.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  tip_init.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  tip_init.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  tip_init.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  tip_init.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  tip_init.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  tip_init.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  tip_init.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  tip_init.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  mtx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_a8;
  local_a8 = (undefined1  [8])0xc87aea;
  auStack_a0 = (undefined1  [8])0xc87b29;
  mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = 0;
  mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&PTR__lazy_ostream_011481f0;
  mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
  ;
  local_210._M_t.super___uniq_ptr_impl<ECC_Context,_std::default_delete<ECC_Context>_>._M_t.
  super__Tuple_impl<0UL,_ECC_Context_*,_std::default_delete<ECC_Context>_>.
  super__Head_base<0UL,_ECC_Context_*,_false>._M_head_impl =
       (__uniq_ptr_data<ECC_Context,_std::default_delete<ECC_Context>,_true,_true>)
       ((long)
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
       + 0x68);
  pvVar12 = (iterator)0x2;
  pvVar13 = (iterator)0x0;
  tip_init.super_base_blob<256U>.m_data._M_elems[0] = bVar5;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&tip_init,(lazy_ostream *)&mtx,2,0,WARN,_cVar16,(size_t)&local_218,
             0xea);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(tip_init.super_base_blob<256U>.m_data._M_elems + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_208.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             (split_hash.super_base_blob<256U>.m_data._M_elems + 8));
  pCVar7 = Params();
  CBlockHeader::GetHash((uint256 *)&mtx,&(pCVar7->genesis).super_CBlockHeader);
  MinerTestingSetup::GoodBlock((MinerTestingSetup *)&last_mined,(uint256 *)this);
  local_238 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
  ;
  local_230 = "";
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xec;
  file_00.m_begin = (iterator)&local_238;
  msg_00.m_end = pvVar13;
  msg_00.m_begin = pvVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_248,
             msg_00);
  std::__shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_258,&last_mined.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>);
  tip_init.super_base_blob<256U>.m_data._M_elems[0] =
       test_method::anon_class_16_2_369edf7f::operator()
                 (&ProcessBlock,(shared_ptr<const_CBlock> *)&local_258);
  tip_init.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  tip_init.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  tip_init.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  tip_init.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  tip_init.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  tip_init.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  tip_init.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  tip_init.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  tip_init.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  tip_init.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  tip_init.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  tip_init.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  tip_init.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  tip_init.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  tip_init.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  tip_init.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  split_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_1498605;
  split_hash.super_base_blob<256U>.m_data._M_elems._8_8_ = (long)"ProcessBlock(last_mined)" + 0x18;
  mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = 0;
  mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&PTR__lazy_ostream_011481f0;
  mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  mtx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&split_hash;
  local_268 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
  ;
  local_260 = "";
  pvVar12 = (iterator)0x2;
  puVar14 = (uint256 *)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&tip_init,(lazy_ostream *)&mtx,2,0,WARN,_cVar16,(size_t)&local_268,
             0xec);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(tip_init.super_base_blob<256U>.m_data._M_elems + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_258._M_refcount);
  val = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_RegTestingSetup.super_TestingSetup.
         super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman;
  iVar6 = 3;
  while( true ) {
    this_00 = (pointer)local_a8;
    bVar5 = iVar6 == 0;
    iVar6 = iVar6 + -1;
    if (bVar5) break;
    local_278 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
    ;
    local_270 = "";
    local_288 = &boost::unit_test::basic_cstring<char_const>::null;
    local_280 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0xf0;
    file_01.m_begin = (iterator)&local_278;
    msg_01.m_end = (iterator)puVar14;
    msg_01.m_begin = pvVar12;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_288,
               msg_01);
    mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish._0_1_ = 0;
    mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&PTR__lazy_ostream_011480b0;
    mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    mtx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0xc7f1cc;
    local_298 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
    ;
    local_290 = "";
    CBlockHeader::GetHash
              (&tip_init,
               &(last_mined.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_CBlockHeader);
    inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
              (val,
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
               ,0xf0,"test_method","m_node.chainman");
    inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
              (val,
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
               ,0xf0,"operator()","m_node.chainman");
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)this_00,&cs_main,
               "inline_assertion_check<true>(m_node.chainman, \"/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp\", 240, __func__, \"m_node.chainman\")->GetMutex()"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
               ,0xf0,false);
    pCVar8 = ChainstateManager::ActiveChainstate
                       ((val->_M_t).
                        super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                        .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    puVar14 = &split_hash;
    CBlockIndex::GetBlockHash
              (puVar14,(pCVar8->m_chain).vChain.
                       super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                       super__Vector_impl_data._M_finish[-1]);
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)this_00);
    pvVar12 = (iterator)0x2;
    pCVar15 = (CMutableTransaction *)&tip_init;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (&mtx,&local_298,0xf0,1,2,(CMutableTransaction *)&tip_init,"last_mined->GetHash()",
               puVar14,
               "(MaybeCheckNotHeld(inline_assertion_check<true>(m_node.chainman, \"/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp\", 240, __func__, \"m_node.chainman\")->GetMutex()), [&]() -> decltype(auto) { UniqueLock criticalblock16(MaybeCheckNotHeld(inline_assertion_check<true>(m_node.chainman, \"/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp\", 240, __func__, \"m_node.chainman\")->GetMutex()), \"inline_assertion_check<true>(m_node.chainman, \\\"/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp\\\", 240, __func__, \\\"m_node.chainman\\\")->GetMutex()\", \"/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp\", 240); return m_node.chainman->ActiveChain().Tip()->GetBlockHash(); }())"
              );
    split_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
         *(undefined8 *)
          ((last_mined.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems;
    split_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
         *(undefined8 *)
          (((last_mined.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 8);
    split_hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
         *(undefined8 *)
          (((last_mined.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0x10);
    split_hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
         *(undefined8 *)
          (((last_mined.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0x18);
    txs.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    txs.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    txs.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (iVar9 = -0x16; iVar9 != 0; iVar9 = iVar9 + 1) {
      CMutableTransaction::CMutableTransaction(&mtx);
      peVar2 = ((((last_mined.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 vtx).
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      tip_init.super_base_blob<256U>.m_data._M_elems._0_8_ =
           *(undefined8 *)&(peVar2->hash).m_wrapped;
      tip_init.super_base_blob<256U>.m_data._M_elems._8_8_ =
           *(undefined8 *)((long)&peVar2->hash + 8);
      tip_init.super_base_blob<256U>.m_data._M_elems._16_8_ =
           *(undefined8 *)((long)&peVar2->hash + 0x10);
      tip_init.super_base_blob<256U>.m_data._M_elems._24_8_ =
           *(undefined8 *)((long)&peVar2->hash + 0x18);
      local_98[0].pi_ = (sp_counted_base *)0x0;
      local_98[1].pi_ = (sp_counted_base *)0x0;
      local_a8 = (undefined1  [8])0x0;
      auStack_a0 = (undefined1  [8])0x0;
      std::vector<CTxIn,std::allocator<CTxIn>>::emplace_back<COutPoint,CScript>
                ((vector<CTxIn,std::allocator<CTxIn>> *)&mtx,(COutPoint *)&tip_init,
                 (CScript *)this_00);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)this_00);
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::push_back(&((mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                     super__Vector_impl_data._M_start)->scriptWitness).stack,
                  &WITNESS_STACK_ELEM_OP_TRUE);
      std::vector<CTxOut,_std::allocator<CTxOut>_>::push_back
                (&mtx.vout,
                 (value_type *)
                 (*(long *)&((((((last_mined.
                                  super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr)->vtx).
                                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr)->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_> +
                 0x28));
      (mtx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
      _M_start)->nValue =
           (mtx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start)->nValue + -1000;
      std::make_shared<CTransaction_const,CMutableTransaction&>((CMutableTransaction *)&tip_init);
      std::
      vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
      ::emplace_back<std::shared_ptr<CTransaction_const>>
                ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
                  *)&txs,(shared_ptr<const_CTransaction> *)&tip_init);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 (tip_init.super_base_blob<256U>.m_data._M_elems + 8));
      CBlockHeader::GetHash
                (&tip_init,
                 &(last_mined.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_CBlockHeader);
      MinerTestingSetup::GoodBlock((MinerTestingSetup *)this_00,(uint256 *)this);
      std::__shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&last_mined.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2> *)this_00);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_a0);
      local_2c8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
      ;
      local_2c0 = "";
      local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_02.m_end = (iterator)0x101;
      file_02.m_begin = (iterator)&local_2c8;
      msg_02.m_end = (iterator)pCVar15;
      msg_02.m_begin = pvVar12;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2d8,
                 msg_02);
      std::__shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_2e8,&last_mined.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>
                );
      bVar5 = test_method::anon_class_16_2_369edf7f::operator()
                        (&ProcessBlock,(shared_ptr<const_CBlock> *)&local_2e8);
      local_a8[0] = bVar5;
      auStack_a0 = (undefined1  [8])0x0;
      local_98[0].pi_ = (sp_counted_base *)0x0;
      local_1a8 = (undefined1  [8])0xc87b2a;
      local_1a0 = (element_type *)0xc87b42;
      tip_init.super_base_blob<256U>.m_data._M_elems._8_8_ =
           tip_init.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
      tip_init.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_011481f0;
      tip_init.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
      tip_init.super_base_blob<256U>.m_data._M_elems._24_8_ = local_1a8;
      local_2f8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
      ;
      local_2f0 = "";
      pvVar12 = (iterator)0x2;
      pCVar15 = (CMutableTransaction *)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)this_00,(lazy_ostream *)&tip_init,2,0,WARN,(check_type)puVar14,
                 (size_t)&local_2f8,0x101);
      boost::detail::shared_count::~shared_count(local_98);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2e8._M_refcount);
      CMutableTransaction::~CMutableTransaction(&mtx);
    }
    for (iVar9 = -100; iVar9 != 0; iVar9 = iVar9 + 1) {
      CBlockHeader::GetHash
                ((uint256 *)&mtx,
                 &(last_mined.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_CBlockHeader);
      MinerTestingSetup::GoodBlock((MinerTestingSetup *)&tip_init,(uint256 *)this);
      std::__shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&last_mined.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2> *)&tip_init);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 (tip_init.super_base_blob<256U>.m_data._M_elems + 8));
      local_308 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
      ;
      local_300 = "";
      local_318 = &boost::unit_test::basic_cstring<char_const>::null;
      local_310 = &boost::unit_test::basic_cstring<char_const>::null;
      file_03.m_end = (iterator)0x107;
      file_03.m_begin = (iterator)&local_308;
      msg_03.m_end = (iterator)pCVar15;
      msg_03.m_begin = pvVar12;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_318,
                 msg_03);
      std::__shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_328,&last_mined.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>
                );
      bVar5 = test_method::anon_class_16_2_369edf7f::operator()
                        (&ProcessBlock,(shared_ptr<const_CBlock> *)&local_328);
      tip_init.super_base_blob<256U>.m_data._M_elems[0] = bVar5;
      tip_init.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      local_a8 = (undefined1  [8])0xc87b2a;
      auStack_a0 = (undefined1  [8])0xc87b42;
      mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_1_ = 0;
      mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&PTR__lazy_ostream_011481f0;
      mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
      local_338 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
      ;
      local_330 = "";
      pvVar12 = (iterator)0x2;
      pCVar15 = (CMutableTransaction *)0x0;
      mtx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
      _M_start = this_00;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&tip_init,(lazy_ostream *)&mtx,2,0,WARN,(check_type)puVar14,
                 (size_t)&local_338,0x107);
      boost::detail::shared_count::~shared_count
                ((shared_count *)(tip_init.super_base_blob<256U>.m_data._M_elems + 0x10));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_328._M_refcount);
    }
    CBlockHeader::GetHash
              (&tip_init,
               &(last_mined.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_CBlockHeader);
    reorg.
    super__Vector_base<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    reorg.
    super__Vector_base<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    reorg.
    super__Vector_base<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    MinerTestingSetup::GoodBlock((MinerTestingSetup *)&mtx,(uint256 *)this);
    std::__shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&last_mined.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2> *)&mtx);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish);
    std::vector<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>::
    push_back(&reorg,(value_type *)
                     &last_mined.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>);
    lVar10 = ((long)txs.
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)txs.
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) + 0x65;
    while (bVar5 = lVar10 != 0, lVar10 = lVar10 + -1, bVar5) {
      CBlockHeader::GetHash
                ((uint256 *)&mtx,
                 &(last_mined.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_CBlockHeader);
      MinerTestingSetup::GoodBlock((MinerTestingSetup *)this_00,(uint256 *)this);
      std::__shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&last_mined.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2> *)this_00);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_a0);
      std::vector<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>::
      push_back(&reorg,(value_type *)
                       &last_mined.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>);
    }
    pvVar12 = (iterator)0x117;
    pvVar13 = (iterator)0x0;
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (&criticalblock17,&cs_main,"cs_main",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
               ,0x117,false);
    psVar4 = txs.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (tx = txs.
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_start; tx != psVar4; tx = tx + 1) {
      ChainstateManager::ProcessTransaction
                ((MempoolAcceptResult *)&mtx,
                 (val->_M_t).
                 super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                 .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl,tx,false);
      local_368 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
      ;
      local_360 = "";
      local_378 = &boost::unit_test::basic_cstring<char_const>::null;
      local_370 = &boost::unit_test::basic_cstring<char_const>::null;
      file_04.m_end = (iterator)0x11a;
      file_04.m_begin = (iterator)&local_368;
      msg_04.m_end = pvVar13;
      msg_04.m_begin = pvVar12;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_378,
                 msg_04);
      local_1a8[0] = (int)mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_start == 0;
      local_1a0 = (element_type *)0x0;
      a_Stack_198[0]._M_t.
      super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
      super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl =
           (tuple<interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>)
           (_Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>)0x0;
      rpc_thread._M_id._M_thread =
           (id)((long)"parent2_v2_result.m_result_type == MempoolAcceptResult::ResultType::VALID" +
               0xb);
      auStack_a0 = (undefined1  [8])((ulong)auStack_a0 & 0xffffffffffffff00);
      local_a8 = (undefined1  [8])&PTR__lazy_ostream_011481f0;
      local_98[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_98[1].pi_ = (sp_counted_base *)&rpc_thread;
      local_398 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
      ;
      local_390 = "";
      pvVar12 = (iterator)0x2;
      pvVar13 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_1a8,(lazy_ostream *)this_00,2,0,WARN,(check_type)puVar14,
                 (size_t)&local_398,0x11a);
      boost::detail::shared_count::~shared_count((shared_count *)a_Stack_198);
      MempoolAcceptResult::~MempoolAcceptResult((MempoolAcceptResult *)&mtx);
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock17.super_unique_lock);
    local_3a8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
    ;
    local_3a0 = "";
    local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_05.m_end = (iterator)0x120;
    file_05.m_begin = (iterator)&local_3a8;
    msg_05.m_end = pvVar13;
    msg_05.m_begin = pvVar12;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_3b8,
               msg_05);
    mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish._0_1_ = 0;
    mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&PTR__lazy_ostream_011480b0;
    mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    mtx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0xc7f1cc;
    local_3c8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
    ;
    local_3c0 = "";
    local_a8 = (undefined1  [8])
               CTxMemPool::size((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_RegTestingSetup.
                                super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.
                                m_node.mempool._M_t.
                                super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>.
                                _M_t.
                                super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>
                                .super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
    local_1a8 = (undefined1  [8])
                ((long)txs.
                       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)txs.
                       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4);
    pvVar12 = (iterator)0x2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (&mtx,&local_3c8,0x120,1,2,this_00,"m_node.mempool->size()",local_1a8,"txs.size()");
    rpc_thread._M_id._M_thread = (id)0;
    mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)operator_new(0x20);
    *(undefined ***)
     ((mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems =
         &PTR___State_0114da88;
    *(mempool_locks_reorg **)
     (((mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
       _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) = this;
    *(vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      **)(((mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
            super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
          _M_elems + 0x10) = &txs;
    *(CMutableTransaction **)
     (((mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
       _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
         (CMutableTransaction *)&tip_init;
    std::thread::_M_start_thread(&rpc_thread,&mtx,0);
    p_Var11 = &(reorg.
                super__Vector_base<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
               super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>;
    p_Var3 = &(reorg.
               super__Vector_base<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->
              super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>;
    if (mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      (**(code **)(*(long *)((mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                              super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.
                            super_base_blob<256U>.m_data._M_elems + 8))();
      p_Var11 = &(reorg.
                  super__Vector_base<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>;
      p_Var3 = &(reorg.
                 super__Vector_base<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->
                super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>;
    }
    for (; p_Var11 != p_Var3; p_Var11 = p_Var11 + 1) {
      std::__shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_3d8,p_Var11);
      test_method::anon_class_16_2_369edf7f::operator()
                (&ProcessBlock,(shared_ptr<const_CBlock> *)&local_3d8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3d8._M_refcount);
    }
    local_3e8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
    ;
    local_3e0 = "";
    local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_06.m_end = (iterator)0x141;
    file_06.m_begin = (iterator)&local_3e8;
    msg_06.m_end = (iterator)this_00;
    msg_06.m_begin = pvVar12;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_3f8,
               msg_06);
    puVar14 = (uint256 *)local_a8;
    mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish._0_1_ = 0;
    mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&PTR__lazy_ostream_011480b0;
    mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    mtx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0xc7f1cc;
    local_408 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
    ;
    local_400 = "";
    CBlockHeader::GetHash
              (puVar14,&(last_mined.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->super_CBlockHeader);
    inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
              (val,
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
               ,0x141,"test_method","m_node.chainman");
    inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
              (val,
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
               ,0x141,"operator()","m_node.chainman");
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (&criticalblock17,&cs_main,
               "inline_assertion_check<true>(m_node.chainman, \"/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp\", 321, __func__, \"m_node.chainman\")->GetMutex()"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
               ,0x141,false);
    pCVar8 = ChainstateManager::ActiveChainstate
                       ((val->_M_t).
                        super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                        .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    CBlockIndex::GetBlockHash
              ((uint256 *)local_1a8,
               (pCVar8->m_chain).vChain.
               super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
               super__Vector_impl_data._M_finish[-1]);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock17.super_unique_lock);
    pvVar12 = (iterator)0x2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (&mtx,&local_408,0x141,1,2,puVar14,"last_mined->GetHash()",(uint256 *)local_1a8,
               "(MaybeCheckNotHeld(inline_assertion_check<true>(m_node.chainman, \"/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp\", 321, __func__, \"m_node.chainman\")->GetMutex()), [&]() -> decltype(auto) { UniqueLock criticalblock20(MaybeCheckNotHeld(inline_assertion_check<true>(m_node.chainman, \"/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp\", 321, __func__, \"m_node.chainman\")->GetMutex()), \"inline_assertion_check<true>(m_node.chainman, \\\"/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp\\\", 321, __func__, \\\"m_node.chainman\\\")->GetMutex()\", \"/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp\", 321); return m_node.chainman->ActiveChain().Tip()->GetBlockHash(); }())"
              );
    std::thread::join();
    std::thread::~thread(&rpc_thread);
    std::vector<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>::
    ~vector(&reorg);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector(&txs);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&last_mined.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(mempool_locks_reorg)
{
    bool ignored;
    auto ProcessBlock = [&](std::shared_ptr<const CBlock> block) -> bool {
        return Assert(m_node.chainman)->ProcessNewBlock(block, /*force_processing=*/true, /*min_pow_checked=*/true, /*new_block=*/&ignored);
    };

    // Process all mined blocks
    BOOST_REQUIRE(ProcessBlock(std::make_shared<CBlock>(Params().GenesisBlock())));
    auto last_mined = GoodBlock(Params().GenesisBlock().GetHash());
    BOOST_REQUIRE(ProcessBlock(last_mined));

    // Run the test multiple times
    for (int test_runs = 3; test_runs > 0; --test_runs) {
        BOOST_CHECK_EQUAL(last_mined->GetHash(), WITH_LOCK(Assert(m_node.chainman)->GetMutex(), return m_node.chainman->ActiveChain().Tip()->GetBlockHash()));

        // Later on split from here
        const uint256 split_hash{last_mined->hashPrevBlock};

        // Create a bunch of transactions to spend the miner rewards of the
        // most recent blocks
        std::vector<CTransactionRef> txs;
        for (int num_txs = 22; num_txs > 0; --num_txs) {
            CMutableTransaction mtx;
            mtx.vin.emplace_back(COutPoint{last_mined->vtx[0]->GetHash(), 1}, CScript{});
            mtx.vin[0].scriptWitness.stack.push_back(WITNESS_STACK_ELEM_OP_TRUE);
            mtx.vout.push_back(last_mined->vtx[0]->vout[1]);
            mtx.vout[0].nValue -= 1000;
            txs.push_back(MakeTransactionRef(mtx));

            last_mined = GoodBlock(last_mined->GetHash());
            BOOST_REQUIRE(ProcessBlock(last_mined));
        }

        // Mature the inputs of the txs
        for (int j = COINBASE_MATURITY; j > 0; --j) {
            last_mined = GoodBlock(last_mined->GetHash());
            BOOST_REQUIRE(ProcessBlock(last_mined));
        }

        // Mine a reorg (and hold it back) before adding the txs to the mempool
        const uint256 tip_init{last_mined->GetHash()};

        std::vector<std::shared_ptr<const CBlock>> reorg;
        last_mined = GoodBlock(split_hash);
        reorg.push_back(last_mined);
        for (size_t j = COINBASE_MATURITY + txs.size() + 1; j > 0; --j) {
            last_mined = GoodBlock(last_mined->GetHash());
            reorg.push_back(last_mined);
        }

        // Add the txs to the tx pool
        {
            LOCK(cs_main);
            for (const auto& tx : txs) {
                const MempoolAcceptResult result = m_node.chainman->ProcessTransaction(tx);
                BOOST_REQUIRE(result.m_result_type == MempoolAcceptResult::ResultType::VALID);
            }
        }

        // Check that all txs are in the pool
        {
            BOOST_CHECK_EQUAL(m_node.mempool->size(), txs.size());
        }

        // Run a thread that simulates an RPC caller that is polling while
        // validation is doing a reorg
        std::thread rpc_thread{[&]() {
            // This thread is checking that the mempool either contains all of
            // the transactions invalidated by the reorg, or none of them, and
            // not some intermediate amount.
            while (true) {
                LOCK(m_node.mempool->cs);
                if (m_node.mempool->size() == 0) {
                    // We are done with the reorg
                    break;
                }
                // Internally, we might be in the middle of the reorg, but
                // externally the reorg to the most-proof-of-work chain should
                // be atomic. So the caller assumes that the returned mempool
                // is consistent. That is, it has all txs that were there
                // before the reorg.
                assert(m_node.mempool->size() == txs.size());
                continue;
            }
            LOCK(cs_main);
            // We are done with the reorg, so the tip must have changed
            assert(tip_init != m_node.chainman->ActiveChain().Tip()->GetBlockHash());
        }};

        // Submit the reorg in this thread to invalidate and remove the txs from the tx pool
        for (const auto& b : reorg) {
            ProcessBlock(b);
        }
        // Check that the reorg was eventually successful
        BOOST_CHECK_EQUAL(last_mined->GetHash(), WITH_LOCK(Assert(m_node.chainman)->GetMutex(), return m_node.chainman->ActiveChain().Tip()->GetBlockHash()));

        // We can join the other thread, which returns when the reorg was successful
        rpc_thread.join();
    }
}